

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::FetchCommittedRangeValidity
               (UpdateInfo *info,idx_t start,idx_t end,idx_t result_offset,Vector *result)

{
  ValidityMask *in_RSI;
  idx_t in_RDI;
  idx_t unaff_retaddr;
  ValidityMask *result_mask;
  
  FlatVector::Validity((Vector *)0xbbe517);
  MergeUpdateInfoRangeValidity((UpdateInfo *)result,(idx_t)result_mask,unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

static void FetchCommittedRangeValidity(UpdateInfo &info, idx_t start, idx_t end, idx_t result_offset, Vector &result) {
	auto &result_mask = FlatVector::Validity(result);
	MergeUpdateInfoRangeValidity(info, start, end, result_offset, result_mask);
}